

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  Random *random;
  pointer ppTVar1;
  TestSuite *pTVar2;
  TestSuite **test_suite;
  pointer ppTVar3;
  
  random = &this->random_;
  ShuffleRange<int>(random,0,this->last_death_test_suite_ + 1,&this->test_suite_indices_);
  ShuffleRange<int>(random,this->last_death_test_suite_ + 1,
                    (int)((ulong)((long)(this->test_suites_).
                                        super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->test_suites_).
                                       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    &this->test_suite_indices_);
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1
      ) {
    pTVar2 = *ppTVar3;
    ShuffleRange<int>(random,0,(int)((ulong)((long)(pTVar2->test_indices_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pTVar2->test_indices_).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2),
                      &pTVar2->test_indices_);
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test suites.
  ShuffleRange(random(), 0, last_death_test_suite_ + 1, &test_suite_indices_);

  // Shuffles the non-death test suites.
  ShuffleRange(random(), last_death_test_suite_ + 1,
               static_cast<int>(test_suites_.size()), &test_suite_indices_);

  // Shuffles the tests inside each test suite.
  for (auto& test_suite : test_suites_) {
    test_suite->ShuffleTests(random());
  }
}